

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

string * __thiscall
GraphPropagator::all_to_dot_abi_cxx11_
          (string *__return_storage_ptr__,GraphPropagator *this,int *arr)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long *plVar4;
  BoolView *pBVar5;
  undefined8 *puVar6;
  char cVar7;
  ulong uVar8;
  ulong *puVar9;
  long *plVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  string __str;
  string __str_3;
  string __str_2;
  long *local_f8;
  long local_e8;
  long lStack_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  GraphPropagator *local_90;
  string *local_88;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  int *local_60;
  long local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_98 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_98;
  local_60 = arr;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"graph {\n","");
  local_90 = this;
  if (0 < (int)(this->vs).sz) {
    uVar12 = 0;
    do {
      pBVar5 = (this->vs).data;
      cVar7 = sat.assigns.data[(uint)pBVar5[uVar12].v];
      if (cVar7 != 0) {
        if ((uint)pBVar5[uVar12].s * -2 + 1 == (int)cVar7) {
          uVar13 = 1;
          if (9 < uVar12) {
            uVar8 = uVar12;
            uVar1 = 4;
            do {
              uVar13 = uVar1;
              uVar11 = (uint)uVar8;
              if (uVar11 < 100) {
                uVar13 = uVar13 - 2;
                goto LAB_001cae29;
              }
              if (uVar11 < 1000) {
                uVar13 = uVar13 - 1;
                goto LAB_001cae29;
              }
              if (uVar11 < 10000) goto LAB_001cae29;
              uVar8 = (uVar8 & 0xffffffff) / 10000;
              uVar1 = uVar13 + 4;
            } while (99999 < uVar11);
            uVar13 = uVar13 + 1;
          }
LAB_001cae29:
          local_b8 = &local_a8;
          std::__cxx11::string::_M_construct((ulong)&local_b8,(char)uVar13);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b8,uVar13,(uint)uVar12);
          plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x1d8ae4);
          local_d8 = &local_c8;
          puVar9 = (ulong *)(plVar4 + 2);
          if ((ulong *)*plVar4 == puVar9) {
            local_c8 = *puVar9;
            lStack_c0 = plVar4[3];
          }
          else {
            local_c8 = *puVar9;
            local_d8 = (ulong *)*plVar4;
          }
          local_d0 = plVar4[1];
          *plVar4 = (long)puVar9;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_d8);
          local_f8 = &local_e8;
          plVar10 = plVar4 + 2;
          if ((long *)*plVar4 == plVar10) {
            local_e8 = *plVar10;
            lStack_e0 = plVar4[3];
          }
          else {
            local_e8 = *plVar10;
            local_f8 = (long *)*plVar4;
          }
          *plVar4 = (long)plVar10;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8);
          if (local_f8 != &local_e8) {
            operator_delete(local_f8);
          }
          if (local_d8 != &local_c8) {
            operator_delete(local_d8);
          }
          if (local_b8 != &local_a8) {
            operator_delete(local_b8);
          }
          pBVar5 = (local_90->vs).data;
          cVar7 = sat.assigns.data[(uint)pBVar5[uVar12].v];
          this = local_90;
          if (cVar7 == '\0') goto LAB_001cb114;
        }
        this = local_90;
        if ((uint)pBVar5[uVar12].s * 2 + -1 == (int)cVar7) {
          uVar13 = 1;
          if (9 < uVar12) {
            uVar8 = uVar12;
            uVar1 = 4;
            do {
              uVar13 = uVar1;
              uVar11 = (uint)uVar8;
              if (uVar11 < 100) {
                uVar13 = uVar13 - 2;
                goto LAB_001cafe5;
              }
              if (uVar11 < 1000) {
                uVar13 = uVar13 - 1;
                goto LAB_001cafe5;
              }
              if (uVar11 < 10000) goto LAB_001cafe5;
              uVar8 = (uVar8 & 0xffffffff) / 10000;
              uVar1 = uVar13 + 4;
            } while (99999 < uVar11);
            uVar13 = uVar13 + 1;
          }
LAB_001cafe5:
          local_b8 = &local_a8;
          std::__cxx11::string::_M_construct((ulong)&local_b8,(char)uVar13);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b8,uVar13,(uint)uVar12);
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x1d8ae4);
          local_d8 = &local_c8;
          puVar9 = puVar6 + 2;
          if ((ulong *)*puVar6 == puVar9) {
            local_c8 = *puVar9;
            lStack_c0 = puVar6[3];
          }
          else {
            local_c8 = *puVar9;
            local_d8 = (ulong *)*puVar6;
          }
          local_d0 = puVar6[1];
          *puVar6 = puVar9;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
          local_f8 = &local_e8;
          plVar4 = puVar6 + 2;
          if ((long *)*puVar6 == plVar4) {
            local_e8 = *plVar4;
            lStack_e0 = puVar6[3];
          }
          else {
            local_e8 = *plVar4;
            local_f8 = (long *)*puVar6;
          }
          *puVar6 = plVar4;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8);
          if (local_f8 != &local_e8) {
            operator_delete(local_f8);
          }
          if (local_d8 != &local_c8) {
            operator_delete(local_d8);
          }
          this = local_90;
          if (local_b8 != &local_a8) {
            operator_delete(local_b8);
            this = local_90;
          }
        }
      }
LAB_001cb114:
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)(int)(this->vs).sz);
  }
  if (0 < (int)(this->es).sz) {
    lVar14 = 0;
    local_88 = __return_storage_ptr__;
    do {
      local_58 = lVar14 * 3;
      uVar13 = **(uint **)&(this->endnodes).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar14].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data;
      uVar1 = -uVar13;
      if (0 < (int)uVar13) {
        uVar1 = uVar13;
      }
      uVar11 = 1;
      if (9 < uVar1) {
        uVar12 = (ulong)uVar1;
        uVar2 = 4;
        do {
          uVar11 = uVar2;
          uVar3 = (uint)uVar12;
          if (uVar3 < 100) {
            uVar11 = uVar11 - 2;
            goto LAB_001cb1b5;
          }
          if (uVar3 < 1000) {
            uVar11 = uVar11 - 1;
            goto LAB_001cb1b5;
          }
          if (uVar3 < 10000) goto LAB_001cb1b5;
          uVar12 = uVar12 / 10000;
          uVar2 = uVar11 + 4;
        } while (99999 < uVar3);
        uVar11 = uVar11 + 1;
      }
LAB_001cb1b5:
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar11 - (char)((int)uVar13 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0] + (uVar13 >> 0x1f),uVar11,uVar1);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1d8ae4);
      local_b8 = &local_a8;
      plVar10 = plVar4 + 2;
      if ((long *)*plVar4 == plVar10) {
        local_a8 = *plVar10;
        lStack_a0 = plVar4[3];
      }
      else {
        local_a8 = *plVar10;
        local_b8 = (long *)*plVar4;
      }
      local_b0 = plVar4[1];
      *plVar4 = (long)plVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_b8);
      __return_storage_ptr__ = local_88;
      puVar9 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar9) {
        local_c8 = *puVar9;
        lStack_c0 = plVar4[3];
        local_d8 = &local_c8;
      }
      else {
        local_c8 = *puVar9;
        local_d8 = (ulong *)*plVar4;
      }
      local_d0 = plVar4[1];
      *plVar4 = (long)puVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      uVar13 = *(uint *)(*(long *)((long)&(((local_90->endnodes).
                                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                          super__Vector_impl_data + local_58 * 8) + 4);
      uVar1 = -uVar13;
      if (0 < (int)uVar13) {
        uVar1 = uVar13;
      }
      uVar11 = 1;
      if (9 < uVar1) {
        uVar12 = (ulong)uVar1;
        uVar2 = 4;
        do {
          uVar11 = uVar2;
          uVar3 = (uint)uVar12;
          if (uVar3 < 100) {
            uVar11 = uVar11 - 2;
            goto LAB_001cb332;
          }
          if (uVar3 < 1000) {
            uVar11 = uVar11 - 1;
            goto LAB_001cb332;
          }
          if (uVar3 < 10000) goto LAB_001cb332;
          uVar12 = uVar12 / 10000;
          uVar2 = uVar11 + 4;
        } while (99999 < uVar3);
        uVar11 = uVar11 + 1;
      }
LAB_001cb332:
      local_80 = local_70;
      std::__cxx11::string::_M_construct
                ((ulong)&local_80,(char)uVar11 - (char)((int)uVar13 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar13 >> 0x1f) + (long)local_80),uVar11,uVar1);
      uVar12 = 0xf;
      if (local_d8 != &local_c8) {
        uVar12 = local_c8;
      }
      if (uVar12 < (ulong)(local_78 + local_d0)) {
        uVar12 = 0xf;
        if (local_80 != local_70) {
          uVar12 = local_70[0];
        }
        if (uVar12 < (ulong)(local_78 + local_d0)) goto LAB_001cb3c5;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_d8);
      }
      else {
LAB_001cb3c5:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_80);
      }
      plVar4 = puVar6 + 2;
      if ((long *)*puVar6 == plVar4) {
        local_e8 = *plVar4;
        lStack_e0 = puVar6[3];
        local_f8 = &local_e8;
      }
      else {
        local_e8 = *plVar4;
        local_f8 = (long *)*puVar6;
      }
      *puVar6 = plVar4;
      puVar6[1] = 0;
      *(undefined1 *)plVar4 = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8);
      if (local_f8 != &local_e8) {
        operator_delete(local_f8);
      }
      if (local_80 != local_70) {
        operator_delete(local_80);
      }
      if (local_d8 != &local_c8) {
        operator_delete(local_d8);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      pBVar5 = (local_90->es).data;
      cVar7 = sat.assigns.data[(uint)pBVar5[lVar14].v];
      if ((cVar7 != '\0') &&
         ((uVar13 = (uint)pBVar5[lVar14].s, uVar13 * -2 + 1 == (int)cVar7 ||
          (uVar13 * 2 + -1 == (int)cVar7)))) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      uVar13 = local_60[lVar14];
      uVar1 = -uVar13;
      if (0 < (int)uVar13) {
        uVar1 = uVar13;
      }
      uVar11 = 1;
      if (9 < uVar1) {
        uVar12 = (ulong)uVar1;
        uVar2 = 4;
        do {
          uVar11 = uVar2;
          uVar3 = (uint)uVar12;
          if (uVar3 < 100) {
            uVar11 = uVar11 - 2;
            goto LAB_001cb54f;
          }
          if (uVar3 < 1000) {
            uVar11 = uVar11 - 1;
            goto LAB_001cb54f;
          }
          if (uVar3 < 10000) goto LAB_001cb54f;
          uVar12 = uVar12 / 10000;
          uVar2 = uVar11 + 4;
        } while (99999 < uVar3);
        uVar11 = uVar11 + 1;
      }
LAB_001cb54f:
      local_b8 = &local_a8;
      std::__cxx11::string::_M_construct
                ((ulong)&local_b8,(char)uVar11 - (char)((int)uVar13 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_b8 + (ulong)(uVar13 >> 0x1f)),uVar11,uVar1);
      puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x1dcf8f);
      puVar9 = puVar6 + 2;
      if ((ulong *)*puVar6 == puVar9) {
        local_c8 = *puVar9;
        lStack_c0 = puVar6[3];
        local_d8 = &local_c8;
      }
      else {
        local_c8 = *puVar9;
        local_d8 = (ulong *)*puVar6;
      }
      local_d0 = puVar6[1];
      *puVar6 = puVar9;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
      plVar4 = puVar6 + 2;
      if ((long *)*puVar6 == plVar4) {
        local_e8 = *plVar4;
        lStack_e0 = puVar6[3];
        local_f8 = &local_e8;
      }
      else {
        local_e8 = *plVar4;
        local_f8 = (long *)*puVar6;
      }
      *puVar6 = plVar4;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8);
      if (local_f8 != &local_e8) {
        operator_delete(local_f8);
      }
      if (local_d8 != &local_c8) {
        operator_delete(local_d8);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      lVar14 = lVar14 + 1;
      this = local_90;
    } while (lVar14 < (int)(local_90->es).sz);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string GraphPropagator::all_to_dot(int* arr) {
	std::string res = "graph {\n";
	for (int n = 0; n < nbNodes(); n++) {
		if (getNodeVar(n).isFixed() && getNodeVar(n).isTrue()) {
			res += " " + std::to_string(n) + " [color = red];\n";
		}
		if (getNodeVar(n).isFixed() && getNodeVar(n).isFalse()) {
			res += " " + std::to_string(n) + " [color = yellow];\n";
		}
	}
	for (int e = 0; e < nbEdges(); e++) {
		res += " " + std::to_string(getTail(e)) + " -- " + std::to_string(getHead(e));
		if (getEdgeVar(e).isFixed() && getEdgeVar(e).isTrue()) {
			res += " [color = red] ";
		} else if (getEdgeVar(e).isFixed() && getEdgeVar(e).isFalse()) {
			res += " [color = yellow] ";
		}
		res += "[label = \"" + std::to_string(arr[e]) + "\"]";
		res += ";\n";
	}
	res += "}";

	return res;
}